

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall smf::MidiMessage::setMetaTempo(MidiMessage *this,double tempo)

{
  setTempoMicroseconds(this,(int)((60.0 / tempo) * 1000000.0 + 0.5));
  return;
}

Assistant:

void MidiMessage::setMetaTempo(double tempo) {
	int microseconds = (int)(60.0 / tempo * 1000000.0 + 0.5);
	setTempoMicroseconds(microseconds);
}